

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.h
# Opt level: O1

bool __thiscall
flatbuffers::BinaryAnnotator::IsValidUnionValue(BinaryAnnotator *this,Field *field,uint8_t value)

{
  bool bVar1;
  Field *pFVar2;
  ushort uVar3;
  uint32_t enum_id;
  
  bVar1 = IsUnionType(this,field);
  if (bVar1) {
    if (*(ushort *)(field + -(long)*(int *)field) < 7) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(field + (6 - (long)*(int *)field));
    }
    if (uVar3 == 0) {
      pFVar2 = (Field *)0x0;
    }
    else {
      pFVar2 = field + (ulong)*(uint *)(field + uVar3) + (ulong)uVar3;
    }
    if (*(ushort *)(pFVar2 + -(long)*(int *)pFVar2) < 9) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(pFVar2 + (8 - (long)*(int *)pFVar2));
    }
    if (uVar3 == 0) {
      enum_id = 0xffffffff;
    }
    else {
      enum_id = *(uint32_t *)(pFVar2 + uVar3);
    }
    bVar1 = IsValidUnionValue(this,enum_id,value);
    return bVar1;
  }
  return false;
}

Assistant:

bool IsValidUnionValue(const reflection::Field *const field,
                         const uint8_t value) {
    return IsUnionType(field) &&
           IsValidUnionValue(field->type()->index(), value);
  }